

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O0

string * __thiscall primesieve::CpuInfo::cpuName_abi_cxx11_(CpuInfo *this)

{
  string *in_RDI;
  exception *anon_var_0;
  
  (anonymous_namespace)::getCpuName_abi_cxx11_();
  return in_RDI;
}

Assistant:

string CpuInfo::cpuName() const
{
  try
  {
    // On Linux we get the CPU name by parsing /proc/cpuinfo
    // which can be quite slow on PCs without fast SSD.
    // For this reason we don't initialize the CPU name at
    // startup but instead we lazy load it when needed.
    return getCpuName();
  }
  catch (exception&)
  {
    return {};
  }
}